

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

int luaL_checkoption(lua_State *L,int arg,char *def,char **lst)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  
  if (def != (char *)0x0) {
    iVar1 = lua_type(L,arg);
    if (iVar1 < 1) goto LAB_00113bdc;
  }
  def = luaL_checklstring(L,arg,(size_t *)0x0);
LAB_00113bdc:
  pcVar2 = *lst;
  if (pcVar2 != (char *)0x0) {
    lVar3 = 0;
    do {
      iVar1 = strcmp(pcVar2,def);
      if (iVar1 == 0) {
        return (int)lVar3;
      }
      pcVar2 = lst[lVar3 + 1];
      lVar3 = lVar3 + 1;
    } while (pcVar2 != (char *)0x0);
  }
  pcVar2 = lua_pushfstring(L,"invalid option \'%s\'",def);
  iVar1 = luaL_argerror(L,arg,pcVar2);
  return iVar1;
}

Assistant:

LUALIB_API int luaL_checkoption (lua_State *L, int arg, const char *def,
                                 const char *const lst[]) {
  const char *name = (def) ? luaL_optstring(L, arg, def) :
                             luaL_checkstring(L, arg);
  int i;
  for (i=0; lst[i]; i++)
    if (strcmp(lst[i], name) == 0)
      return i;
  return luaL_argerror(L, arg,
                       lua_pushfstring(L, "invalid option '%s'", name));
}